

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O2

void pnga_sprs_array_diag_left_multiply(Integer s_a,Integer g_d)

{
  long lVar1;
  double *pdVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  undefined8 uVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  void *buf;
  Integer IVar14;
  ulong uVar15;
  ulong uVar16;
  undefined1 (*pauVar17) [16];
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  ulong iproc;
  long lVar21;
  bool bVar22;
  float fVar23;
  float fVar24;
  int64_t *ilptr;
  int *iptr;
  Integer local_b8;
  ulong local_b0;
  void *vptr;
  int local_9c;
  Integer local_98;
  Integer local_90;
  Integer local_88;
  ulong local_80;
  Integer one;
  int64_t *jlptr;
  int *jptr;
  Integer khi;
  Integer klo;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  
  lVar1 = s_a + 1000;
  lVar21 = g_d + 1000;
  IVar14 = SPA[lVar1].grp;
  local_88 = g_d;
  local_90 = pnga_pgroup_nodeid(IVar14);
  local_b0 = pnga_pgroup_nnodes(IVar14);
  local_b8 = SPA[lVar1].type;
  local_80 = (ulong)(uint)SPA[lVar1].idx_size;
  iptr = (int *)0x0;
  jptr = (int *)0x0;
  ilptr = (int64_t *)0x0;
  jlptr = (int64_t *)0x0;
  one = 1;
  bVar22 = _ga_sync_begin != 0;
  local_9c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  if (bVar22) {
    pnga_pgroup_sync(IVar14);
  }
  local_98 = IVar14;
  if (SPA[lVar1].idim != GA[lVar21].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) dimensions don\'t match",0);
  }
  if (local_b8 != GA[lVar21].type) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) data types don\'t match",0);
  }
  if (GA[lVar21].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) vector not of dimension 1",0);
  }
  pnga_sprs_array_row_distribution(s_a,local_90,&ilo,&ihi);
  buf = malloc(((ihi + 1) - ilo) * SPA[lVar1].size);
  klo = ilo + 1;
  khi = ihi + 1;
  pnga_get(local_88,&klo,&khi,buf,&one);
  uVar15 = 0;
  if ((long)local_b0 < 1) {
    local_b0 = uVar15;
  }
  local_b8 = local_b8 + -0x3e9;
  for (iproc = 0; iproc != local_b0; iproc = iproc + 1) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if ((int)local_80 == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != (void *)0x0) {
        switch(local_b8) {
        case 0:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            uVar16 = (ulong)(uint)(iptr[lVar1 - ilo] - iptr[lVar21]);
            pvVar18 = vptr;
            if (iptr[lVar1 - ilo] - iptr[lVar21] < 1) {
              uVar16 = uVar15;
            }
            while (IVar14 = lVar1, uVar16 != 0) {
              *(int *)((long)pvVar18 + (long)iptr[lVar21] * 4) =
                   *(int *)((long)pvVar18 + (long)iptr[lVar21] * 4) *
                   *(int *)((long)buf + lVar21 * 4);
              uVar16 = uVar16 - 1;
              pvVar18 = (void *)((long)pvVar18 + 4);
            }
          }
          break;
        case 1:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            iVar8 = iptr[lVar21];
            uVar16 = (ulong)(uint)(iptr[lVar1 - ilo] - iVar8);
            if (iptr[lVar1 - ilo] - iVar8 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(long *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8) =
                   *(long *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8) *
                   *(long *)((long)buf + lVar21 * 8);
            }
          }
          break;
        case 2:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            iVar8 = iptr[lVar21];
            uVar16 = (ulong)(uint)(iptr[lVar1 - ilo] - iVar8);
            if (iptr[lVar1 - ilo] - iVar8 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(float *)((long)vptr + uVar19 * 4 + (long)iVar8 * 4) =
                   *(float *)((long)buf + lVar21 * 4) *
                   *(float *)((long)vptr + uVar19 * 4 + (long)iVar8 * 4);
            }
          }
          break;
        case 3:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            iVar8 = iptr[lVar21];
            uVar16 = (ulong)(uint)(iptr[lVar1 - ilo] - iVar8);
            if (iptr[lVar1 - ilo] - iVar8 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(double *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8) =
                   *(double *)((long)buf + lVar21 * 8) *
                   *(double *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8);
            }
          }
          break;
        case 5:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            iVar8 = iptr[lVar21];
            uVar16 = (ulong)(uint)(iptr[lVar1 - ilo] - iVar8);
            if (iptr[lVar1 - ilo] - iVar8 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              fVar3 = *(float *)((long)buf + (lVar21 * 2 + 1) * 4);
              uVar7 = *(undefined8 *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8);
              fVar4 = *(float *)((long)buf + lVar21 * 8);
              fVar23 = (float)uVar7;
              fVar24 = (float)((ulong)uVar7 >> 0x20);
              *(ulong *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8) =
                   CONCAT44(fVar4 * fVar24 + fVar23 * fVar3,fVar4 * fVar23 + fVar24 * -fVar3);
            }
          }
          break;
        case 6:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            iVar8 = iptr[lVar21];
            uVar16 = (ulong)(uint)(iptr[lVar1 - ilo] - iVar8);
            if (iptr[lVar1 - ilo] - iVar8 < 1) {
              uVar16 = uVar15;
            }
            for (lVar20 = 0; IVar14 = lVar1, uVar16 * 0x10 != lVar20; lVar20 = lVar20 + 0x10) {
              dVar5 = *(double *)((long)buf + (lVar21 * 2 + 1) * 8);
              pdVar2 = (double *)((long)vptr + lVar20 + (long)iVar8 * 0x10);
              dVar12 = *pdVar2;
              dVar13 = pdVar2[1];
              dVar6 = *(double *)((long)buf + lVar21 * 0x10);
              dVar11 = dVar6 * dVar13 + dVar12 * dVar5;
              auVar9._8_4_ = SUB84(dVar11,0);
              auVar9._0_8_ = dVar6 * dVar12 + dVar13 * -dVar5;
              auVar9._12_4_ = (int)((ulong)dVar11 >> 0x20);
              *(undefined1 (*) [16])((long)vptr + lVar20 + (long)iVar8 * 0x10) = auVar9;
            }
          }
          break;
        case 0xf:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            iVar8 = iptr[lVar21];
            uVar16 = (ulong)(uint)(iptr[lVar1 - ilo] - iVar8);
            if (iptr[lVar1 - ilo] - iVar8 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(long *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8) =
                   *(long *)((long)vptr + uVar19 * 8 + (long)iVar8 * 8) *
                   *(long *)((long)buf + lVar21 * 8);
            }
          }
        }
      }
    }
    else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != (void *)0x0) {
        switch(local_b8) {
        case 0:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar20 = IVar14 - ilo;
            lVar21 = ilptr[lVar20];
            uVar16 = ilptr[lVar1 - ilo] - lVar21;
            if (ilptr[lVar1 - ilo] - lVar21 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(int *)((long)vptr + uVar19 * 4 + lVar21 * 4) =
                   *(int *)((long)vptr + uVar19 * 4 + lVar21 * 4) * *(int *)((long)buf + lVar20 * 4)
              ;
            }
          }
          break;
        case 1:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            uVar16 = ilptr[lVar1 - ilo] - ilptr[lVar21];
            pvVar18 = vptr;
            if (ilptr[lVar1 - ilo] - ilptr[lVar21] < 1) {
              uVar16 = uVar15;
            }
            while (IVar14 = lVar1, uVar16 != 0) {
              *(long *)((long)pvVar18 + ilptr[lVar21] * 8) =
                   *(long *)((long)pvVar18 + ilptr[lVar21] * 8) * *(long *)((long)buf + lVar21 * 8);
              uVar16 = uVar16 - 1;
              pvVar18 = (void *)((long)pvVar18 + 8);
            }
          }
          break;
        case 2:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar20 = IVar14 - ilo;
            lVar21 = ilptr[lVar20];
            uVar16 = ilptr[lVar1 - ilo] - lVar21;
            if (ilptr[lVar1 - ilo] - lVar21 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(float *)((long)vptr + uVar19 * 4 + lVar21 * 4) =
                   *(float *)((long)buf + lVar20 * 4) *
                   *(float *)((long)vptr + uVar19 * 4 + lVar21 * 4);
            }
          }
          break;
        case 3:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar20 = IVar14 - ilo;
            lVar21 = ilptr[lVar20];
            uVar16 = ilptr[lVar1 - ilo] - lVar21;
            if (ilptr[lVar1 - ilo] - lVar21 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(double *)((long)vptr + uVar19 * 8 + lVar21 * 8) =
                   *(double *)((long)buf + lVar20 * 8) *
                   *(double *)((long)vptr + uVar19 * 8 + lVar21 * 8);
            }
          }
          break;
        case 5:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar20 = IVar14 - ilo;
            lVar21 = ilptr[lVar20];
            uVar16 = ilptr[lVar1 - ilo] - lVar21;
            if (ilptr[lVar1 - ilo] - lVar21 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              fVar3 = *(float *)((long)buf + (lVar20 * 2 + 1) * 4);
              uVar7 = *(undefined8 *)((long)vptr + uVar19 * 8 + lVar21 * 8);
              fVar4 = *(float *)((long)buf + lVar20 * 8);
              fVar23 = (float)uVar7;
              fVar24 = (float)((ulong)uVar7 >> 0x20);
              *(ulong *)((long)vptr + uVar19 * 8 + lVar21 * 8) =
                   CONCAT44(fVar4 * fVar24 + fVar23 * fVar3,fVar4 * fVar23 + fVar24 * -fVar3);
            }
          }
          break;
        case 6:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar21 = IVar14 - ilo;
            uVar16 = ilptr[lVar1 - ilo] - ilptr[lVar21];
            if ((long)uVar16 < 1) {
              uVar16 = uVar15;
            }
            pauVar17 = (undefined1 (*) [16])(ilptr[lVar21] * 0x10 + (long)vptr);
            while (bVar22 = uVar16 != 0, uVar16 = uVar16 - 1, IVar14 = lVar1, bVar22) {
              dVar5 = *(double *)((long)buf + (lVar21 * 2 + 1) * 8);
              dVar6 = *(double *)((long)buf + lVar21 * 0x10);
              dVar11 = dVar6 * *(double *)(*pauVar17 + 8) + *(double *)*pauVar17 * dVar5;
              auVar10._8_4_ = SUB84(dVar11,0);
              auVar10._0_8_ = dVar6 * *(double *)*pauVar17 + *(double *)(*pauVar17 + 8) * -dVar5;
              auVar10._12_4_ = (int)((ulong)dVar11 >> 0x20);
              *pauVar17 = auVar10;
              pauVar17 = pauVar17 + 1;
            }
          }
          break;
        case 0xf:
          IVar14 = ilo;
          while (IVar14 <= ihi) {
            lVar1 = IVar14 + 1;
            lVar20 = IVar14 - ilo;
            lVar21 = ilptr[lVar20];
            uVar16 = ilptr[lVar1 - ilo] - lVar21;
            if (ilptr[lVar1 - ilo] - lVar21 < 1) {
              uVar16 = uVar15;
            }
            for (uVar19 = 0; IVar14 = lVar1, uVar16 != uVar19; uVar19 = uVar19 + 1) {
              *(long *)((long)vptr + uVar19 * 8 + lVar21 * 8) =
                   *(long *)((long)vptr + uVar19 * 8 + lVar21 * 8) *
                   *(long *)((long)buf + lVar20 * 8);
            }
          }
        }
      }
    }
  }
  free(buf);
  if (local_9c != 0) {
    pnga_pgroup_sync(local_98);
  }
  return;
}

Assistant:

void pnga_sprs_array_diag_left_multiply(Integer s_a, Integer g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer d_hdl = GA_OFFSET + g_d;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi, jlo, jhi, klo, khi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr = NULL, *jptr = NULL;
  int64_t *ilptr = NULL, *jlptr = NULL;
  Integer one = 1;
  void *vbuf;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* check for basic compatibility */
  if (SPA[hdl].idim != GA[d_hdl].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) dimensions don't match",0);
  }
  if (type != GA[d_hdl].type) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) data types don't match",0);
  }
  if (GA[d_hdl].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) vector not of dimension 1",0);
  }

#define SPRS_REAL_LEFT_MULTIPLY_M(_type,_iptr)                        \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        _ptr[_iptr[i-ilo]+j] = _buf[i-ilo]*_ptr[_iptr[i-ilo]+j];      \
      }                                                               \
    }                                                                 \
  }

#define SPRS_COMPLEX_LEFT_MULTIPLY_M(_type,_iptr)                     \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    _type rbuf, ibuf, rval, ival;                                     \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        rbuf = _buf[2*(i-ilo)];                                       \
        ibuf = _buf[2*(i-ilo)+1];                                     \
        rval = _ptr[2*(_iptr[i-ilo]+j)];                              \
        ival = _ptr[2*(_iptr[i-ilo]+j)+1];                            \
        _ptr[2*(_iptr[i-ilo]+j)] = rbuf*rval-ibuf*ival;               \
        _ptr[2*(_iptr[i-ilo]+j)+1] = rbuf*ival+ibuf*rval;             \
      }                                                               \
    }                                                                 \
  }

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vbuf = malloc((ihi-ilo+1)*SPA[hdl].size);
  klo = ilo+1;
  khi = ihi+1;
  pnga_get(g_d,&klo,&khi,vbuf,&one);
  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,iptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,iptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,iptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,iptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,iptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,ilptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,ilptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,ilptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,ilptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,ilptr);
        }
      }
    }
  }
  free(vbuf);

#undef SPRS_REAL_LEFT_MULTIPLY
#undef SPRS_COMPLEX_LEFT_MULTIPLY

  if (local_sync_end) pnga_pgroup_sync(grp);
}